

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

Type * soul::ModuleCloner::cloneType
                 (Type *__return_storage_ptr__,StructMappings *structMappings,Type *t)

{
  mapped_type *this;
  RefCountedPtr<soul::Structure> *this_00;
  undefined1 local_58 [9];
  undefined7 local_4f;
  undefined1 uStack_48;
  undefined7 uStack_47;
  RefCountedPtr<soul::Structure> local_40;
  Type local_38;
  
  this_00 = (RefCountedPtr<soul::Structure> *)local_58;
  if (t->category == array) {
    Type::getArrayElementType(&local_38,t);
    cloneType((Type *)(local_58 + 8),structMappings,&local_38);
    Type::createCopyWithNewArrayElementType(__return_storage_ptr__,t,(Type *)(local_58 + 8));
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40);
    this_00 = (RefCountedPtr<soul::Structure> *)((long)&local_38 + 0x10);
  }
  else {
    if (t->category != structure) {
      Type::Type(__return_storage_ptr__,t);
      return __return_storage_ptr__;
    }
    Type::getStruct((Type *)local_58);
    local_38.category = local_58[0];
    local_38.arrayElementCategory = local_58[1];
    local_38.isRef = (bool)local_58[2];
    local_38.isConstant = (bool)local_58[3];
    local_38.primitiveType.type = local_58._4_4_;
    this = std::__detail::
           _Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_soul::Structure_*,_std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>,_std::allocator<std::pair<const_soul::Structure_*const,_soul::RefCountedPtr<soul::Structure>_>_>,_std::__detail::_Select1st,_std::equal_to<const_soul::Structure_*>,_std::hash<const_soul::Structure_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)structMappings,(key_type *)&local_38);
    local_40.object = RefCountedPtr<soul::Structure>::operator*(this);
    local_58[8] = 6;
    local_4f = 0;
    uStack_48 = 0;
    uStack_47 = 0;
    ((local_40.object)->super_RefCountedObject).refCount =
         ((local_40.object)->super_RefCountedObject).refCount + 1;
    Type::withConstAndRefFlags(__return_storage_ptr__,(Type *)(local_58 + 8),t->isConstant,t->isRef)
    ;
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40);
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(this_00);
  return __return_storage_ptr__;
}

Assistant:

static Type cloneType (StructMappings& structMappings, const Type& t)
    {
        if (t.isStruct())
            return Type::createStruct (*structMappings[t.getStruct().get()])
                     .withConstAndRefFlags (t.isConst(), t.isReference());

        if (t.isArray())
            return t.createCopyWithNewArrayElementType (cloneType (structMappings, t.getArrayElementType()));

        return t;
    }